

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector3T.h
# Opt level: O0

ostream * CD_Matrix::operator<<(ostream *os,Vector3T<double,_false> *v)

{
  ostream *poVar1;
  Vector3T<double,_false> *v_local;
  ostream *os_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(os,v->m_x);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->m_y);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->m_z);
  std::operator<<(poVar1," ");
  return os;
}

Assistant:

inline friend std::ostream & operator<<(std::ostream & os, Vector3T<T, normOptimization> const & v)
  {
    os << v.m_x << " " << v.m_y << " " << v.m_z << " ";
    return os;
  }